

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_accept4_(int sockfd,sockaddr *addr,socklen_t *addrlen,int flags)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar1 = accept4(sockfd,(sockaddr *)addr,addrlen,flags);
  if (-1 < iVar1) {
    return iVar1;
  }
  piVar3 = __errno_location();
  if ((*piVar3 != 0x26) && (*piVar3 != 0x16)) {
    return iVar1;
  }
  iVar1 = accept(sockfd,(sockaddr *)addr,addrlen);
  if (iVar1 < 0) {
    return iVar1;
  }
  if ((((uint)flags >> 0x13 & 1) == 0) ||
     (iVar2 = evutil_fast_socket_closeonexec(iVar1), -1 < iVar2)) {
    if (((uint)flags >> 0xb & 1) == 0) {
      return iVar1;
    }
    iVar2 = evutil_fast_socket_nonblocking(iVar1);
    if (-1 < iVar2) {
      return iVar1;
    }
  }
  close(iVar1);
  return -1;
}

Assistant:

evutil_socket_t
evutil_accept4_(evutil_socket_t sockfd, struct sockaddr *addr,
    ev_socklen_t *addrlen, int flags)
{
	evutil_socket_t result;
#if defined(EVENT__HAVE_ACCEPT4) && defined(SOCK_CLOEXEC) && defined(SOCK_NONBLOCK)
	result = accept4(sockfd, addr, addrlen, flags);
	if (result >= 0 || (errno != EINVAL && errno != ENOSYS)) {
		/* A nonnegative result means that we succeeded, so return.
		 * Failing with EINVAL means that an option wasn't supported,
		 * and failing with ENOSYS means that the syscall wasn't
		 * there: in those cases we want to fall back.  Otherwise, we
		 * got a real error, and we should return. */
		return result;
	}
#endif
	result = accept(sockfd, addr, addrlen);
	if (result < 0)
		return result;

	if (flags & EVUTIL_SOCK_CLOEXEC) {
		if (evutil_fast_socket_closeonexec(result) < 0) {
			evutil_closesocket(result);
			return -1;
		}
	}
	if (flags & EVUTIL_SOCK_NONBLOCK) {
		if (evutil_fast_socket_nonblocking(result) < 0) {
			evutil_closesocket(result);
			return -1;
		}
	}
	return result;
}